

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O3

NodePtr __thiscall avro::NodeSymbolic::getNode(NodeSymbolic *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  _func_int **pp_Var4;
  int iVar5;
  Exception *this_00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  long *in_RSI;
  bool bVar6;
  NodePtr NVar7;
  put_holder<char,_std::char_traits<char>_> local_110;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  
  (this->super_NodeImplSymbolic).super_Node._vptr_Node = (_func_int **)0x0;
  lVar3 = in_RSI[0xc];
  (this->super_NodeImplSymbolic).super_Node.type_ = (int)lVar3;
  (this->super_NodeImplSymbolic).super_Node.locked_ = (bool)(char)((ulong)lVar3 >> 0x20);
  *(int3 *)&(this->super_NodeImplSymbolic).super_Node.field_0xd = (int3)((ulong)lVar3 >> 0x28);
  if (lVar3 != 0) {
    iVar5 = *(int *)(lVar3 + 8);
    do {
      if (iVar5 == 0) {
        (this->super_NodeImplSymbolic).super_Node.type_ = AVRO_STRING;
        (this->super_NodeImplSymbolic).super_Node.locked_ = false;
        *(undefined3 *)&(this->super_NodeImplSymbolic).super_Node.field_0xd = 0;
        goto LAB_0014ac71;
      }
      iVar1 = iVar5 + 1;
      LOCK();
      iVar2 = *(int *)(lVar3 + 8);
      bVar6 = iVar5 == iVar2;
      if (bVar6) {
        *(int *)(lVar3 + 8) = iVar1;
        iVar2 = iVar5;
      }
      iVar5 = iVar2;
      UNLOCK();
    } while (!bVar6);
    pp_Var4 = (_func_int **)in_RSI[0xb];
    (this->super_NodeImplSymbolic).super_Node._vptr_Node = pp_Var4;
    if (pp_Var4 != (_func_int **)0x0) {
      NVar7.pn.pi_._0_4_ = iVar1;
      NVar7.px = (element_type *)this;
      NVar7.pn.pi_._4_4_ = 0;
      return NVar7;
    }
  }
LAB_0014ac71:
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_f8,"Could not follow symbol %1%");
  local_110.arg = (void *)(**(code **)(*in_RSI + 0x18))();
  local_110.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,avro::Name_const>;
  local_110.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,avro::Name_const>;
  msg = boost::io::detail::
        feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                  (&local_f8,&local_110);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

NodePtr getNode() const {
        NodePtr node = actualNode_.lock();
        if(!node) {
            throw Exception(boost::format("Could not follow symbol %1%") % name());
        }
        return node;
    }